

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctfst.c
# Opt level: O2

void jpeg_fdct_ifast(DCTELEM *data)

{
  short sVar1;
  short sVar2;
  int iVar3;
  DCTELEM *pDVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  short sVar9;
  int iVar10;
  uint uVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  
  pDVar4 = data;
  for (iVar3 = 7; -1 < iVar3; iVar3 = iVar3 + -1) {
    sVar9 = pDVar4[7] + *pDVar4;
    sVar5 = *pDVar4 - pDVar4[7];
    sVar13 = pDVar4[6] + pDVar4[1];
    sVar7 = pDVar4[1] - pDVar4[6];
    sVar14 = pDVar4[5] + pDVar4[2];
    sVar6 = pDVar4[2] - pDVar4[5];
    sVar1 = pDVar4[4];
    sVar12 = sVar1 + pDVar4[3];
    sVar2 = sVar12 + sVar9;
    sVar9 = sVar9 - sVar12;
    sVar12 = sVar14 + sVar13;
    *pDVar4 = sVar12 + sVar2;
    pDVar4[4] = sVar2 - sVar12;
    sVar2 = (short)((uint)(((int)sVar9 + (int)(short)(sVar13 - sVar14)) * 0xb500) >> 0x10);
    pDVar4[2] = sVar9 + sVar2;
    pDVar4[6] = sVar9 - sVar2;
    iVar10 = (int)(short)((pDVar4[3] + sVar6) - sVar1);
    iVar8 = (int)(short)(sVar7 + sVar5);
    uVar11 = (iVar10 - iVar8) * 0x6200;
    sVar2 = (short)((uint)((short)(sVar6 + sVar7) * 0xb500) >> 0x10);
    sVar12 = sVar5 + sVar2;
    sVar5 = sVar5 - sVar2;
    sVar2 = (short)((uVar11 & 0xffff0000) + iVar10 * 0x8b00 >> 0x10);
    pDVar4[5] = sVar5 + sVar2;
    pDVar4[3] = sVar5 - sVar2;
    sVar2 = (short)((iVar8 * 0x14e00 & 0xffff0000U) + uVar11 >> 0x10);
    pDVar4[1] = sVar12 + sVar2;
    pDVar4[7] = sVar12 - sVar2;
    pDVar4 = pDVar4 + 8;
  }
  for (iVar3 = 7; -1 < iVar3; iVar3 = iVar3 + -1) {
    sVar13 = data[0x38] + *data;
    sVar5 = *data - data[0x38];
    sVar6 = data[0x30] + data[8];
    sVar9 = data[8] - data[0x30];
    sVar14 = data[0x28] + data[0x10];
    sVar7 = data[0x10] - data[0x28];
    sVar1 = data[0x20];
    sVar12 = sVar1 + data[0x18];
    sVar2 = sVar12 + sVar13;
    sVar13 = sVar13 - sVar12;
    sVar12 = sVar14 + sVar6;
    *data = sVar2 + sVar12;
    data[0x20] = sVar2 - sVar12;
    sVar2 = (short)((uint)(((int)sVar13 + (int)(short)(sVar6 - sVar14)) * 0xb500) >> 0x10);
    data[0x10] = sVar13 + sVar2;
    data[0x30] = sVar13 - sVar2;
    iVar10 = (int)(short)((data[0x18] + sVar7) - sVar1);
    iVar8 = (int)(short)(sVar9 + sVar5);
    uVar11 = (iVar10 - iVar8) * 0x6200;
    sVar2 = (short)((uint)((short)(sVar7 + sVar9) * 0xb500) >> 0x10);
    sVar12 = sVar5 + sVar2;
    sVar5 = sVar5 - sVar2;
    sVar2 = (short)((uVar11 & 0xffff0000) + iVar10 * 0x8b00 >> 0x10);
    data[0x28] = sVar5 + sVar2;
    data[0x18] = sVar5 - sVar2;
    sVar2 = (short)((iVar8 * 0x14e00 & 0xffff0000U) + uVar11 >> 0x10);
    data[8] = sVar12 + sVar2;
    data[0x38] = sVar12 - sVar2;
    data = data + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_ifast(DCTELEM *data)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z1, z2, z3, z4, z5, z11, z13;
  DCTELEM *dataptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[0] + dataptr[7];
    tmp7 = dataptr[0] - dataptr[7];
    tmp1 = dataptr[1] + dataptr[6];
    tmp6 = dataptr[1] - dataptr[6];
    tmp2 = dataptr[2] + dataptr[5];
    tmp5 = dataptr[2] - dataptr[5];
    tmp3 = dataptr[3] + dataptr[4];
    tmp4 = dataptr[3] - dataptr[4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[0] = tmp10 + tmp11; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[2] = tmp13 + z1;    /* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;      /* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;         /* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE * 0] + dataptr[DCTSIZE * 7];
    tmp7 = dataptr[DCTSIZE * 0] - dataptr[DCTSIZE * 7];
    tmp1 = dataptr[DCTSIZE * 1] + dataptr[DCTSIZE * 6];
    tmp6 = dataptr[DCTSIZE * 1] - dataptr[DCTSIZE * 6];
    tmp2 = dataptr[DCTSIZE * 2] + dataptr[DCTSIZE * 5];
    tmp5 = dataptr[DCTSIZE * 2] - dataptr[DCTSIZE * 5];
    tmp3 = dataptr[DCTSIZE * 3] + dataptr[DCTSIZE * 4];
    tmp4 = dataptr[DCTSIZE * 3] - dataptr[DCTSIZE * 4];

    /* Even part */

    tmp10 = tmp0 + tmp3;        /* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE * 0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE * 4] = tmp10 - tmp11;

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_707106781); /* c4 */
    dataptr[DCTSIZE * 2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE * 6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;        /* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = MULTIPLY(tmp10 - tmp12, FIX_0_382683433); /* c6 */
    z2 = MULTIPLY(tmp10, FIX_0_541196100) + z5; /* c2-c6 */
    z4 = MULTIPLY(tmp12, FIX_1_306562965) + z5; /* c2+c6 */
    z3 = MULTIPLY(tmp11, FIX_0_707106781); /* c4 */

    z11 = tmp7 + z3;            /* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE * 5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE * 3] = z13 - z2;
    dataptr[DCTSIZE * 1] = z11 + z4;
    dataptr[DCTSIZE * 7] = z11 - z4;

    dataptr++;                  /* advance pointer to next column */
  }
}